

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right,Option *opt)

{
  uint uVar1;
  Layer *pLVar2;
  undefined4 in_register_0000000c;
  ParamDict pd;
  
  if (src->w < right + left) {
    uVar1 = src->h;
  }
  else {
    uVar1 = src->h;
    if (bottom + top <= (int)uVar1) {
      pLVar2 = create_layer(7);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,left);
      ParamDict::set(&pd,1,top);
      ParamDict::set(&pd,2,0);
      ParamDict::set(&pd,3,src->w - (right + left));
      ParamDict::set(&pd,4,src->h - (bottom + top));
      ParamDict::set(&pd,5,-0xe9);
      (*pLVar2->_vptr_Layer[2])(pLVar2,&pd);
      (*pLVar2->_vptr_Layer[4])(pLVar2,opt);
      (*pLVar2->_vptr_Layer[7])(pLVar2,src,dst,opt);
      (*pLVar2->_vptr_Layer[5])(pLVar2,opt);
      (*pLVar2->_vptr_Layer[1])(pLVar2);
      ParamDict::~ParamDict(&pd);
      return;
    }
  }
  fprintf(_stderr,
          "copy_cut_border parameter error, top: %d, bottom: %d, left: %d, right: %d, src.w: %d, src.h: %d"
          ,(ulong)(uint)top,CONCAT44(in_register_0000000c,bottom),left,right,(ulong)(uint)src->w,
          (ulong)uVar1);
  fputc(10,_stderr);
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, const Option& opt)
{
    if (left + right > src.w || top + bottom > src.h)
    {
        NCNN_LOGE("copy_cut_border parameter error, top: %d, bottom: %d, left: %d, right: %d, src.w: %d, src.h: %d", top, bottom, left, right, src.w, src.h);
        return;
    }
    Layer* crop = create_layer(LayerType::Crop);

    ParamDict pd;
    pd.set(0, left);
    pd.set(1, top);
    pd.set(2, 0);
    pd.set(3, src.w - left - right);
    pd.set(4, src.h - top - bottom);
    pd.set(5, -233);

    crop->load_param(pd);

    crop->create_pipeline(opt);

    crop->forward(src, dst, opt);

    crop->destroy_pipeline(opt);

    delete crop;
}